

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O1

double dist_average_time<double,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>,std::uniform_real_distribution<double>>
                 (uniform_real_distribution<double> *dist,
                 linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
                 size_t trials,size_t times)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  timer elapsed;
  timer local_38;
  
  if (trials == 0) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    sVar2 = trials;
    do {
      timer::timer(&local_38);
      dist_single_run<double,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>,std::uniform_real_distribution<double>>
                (dist,generator,times);
      dVar3 = timer::elapsed(&local_38);
      dVar5 = dVar5 + dVar3;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  lVar1 = times * trials;
  auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar4._0_8_ = lVar1;
  auVar4._12_4_ = 0x45300000;
  return (((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 1e-06) / dVar5;
}

Assistant:

double dist_average_time(D& dist, G& generator, size_t trials, size_t times ) {
    double average_time = 0.0;

    for ( size_t i = 0; i < trials; ++i ) {
        timer elapsed;
        dist_single_run<Real>( dist, generator, times );
        average_time += elapsed.elapsed();
    }

    return trials * times / average_time / 1000000.0;
}